

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

BOOL __thiscall Memory::Recycler::CollectNow<(Memory::CollectionFlags)536907776>(Recycler *this)

{
  CollectionState CVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined8 *in_FS_OFFSET;
  
  CVar1 = (this->collectionState).value;
  if ((CVar1 & (CollectionStatePostSweepRedeferralCallback|CollectionStatePostCollectionCallback))
      == CollectionStateNotCollecting) {
    if ((this->disableCollection == false) && (this->isShuttingDown != true)) {
      BVar5 = CollectInternal<(Memory::CollectionFlags)536907776>(this);
      return BVar5;
    }
    if (((CVar1 & ~CollectionStateExit) != CollectionStateNotCollecting) &&
       (this->isShuttingDown == false)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xe1a,
                         "(collectionState == CollectionStateNotCollecting || collectionState == CollectionStateExit || this->isShuttingDown)"
                         ,
                         "collectionState == CollectionStateNotCollecting || collectionState == CollectionStateExit || this->isShuttingDown"
                        );
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar2 = 0;
    }
  }
  return 0;
}

Assistant:

BOOL
Recycler::CollectNow()
{
    // Force-in-thread cannot be concurrent or partial
    CompileAssert((flags & CollectOverride_ForceInThread) == 0 || (flags & (CollectMode_Concurrent | CollectMode_Partial)) == 0);

    // Collections not allowed when the recycler is currently executing the PostCollectionCallback
    if (this->IsAllocatableCallbackState())
    {
        return false;
    }

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if ((disableCollection && (flags & CollectOverride_Explicit) == 0) || isShuttingDown)
#else
    if (isShuttingDown)
#endif
    {
        Assert(collectionState == CollectionStateNotCollecting
            || collectionState == CollectionStateExit
            || this->isShuttingDown);
        return false;
    }

    if (flags & CollectOverride_ExhaustiveCandidate)
    {
        return CollectWithExhaustiveCandidate<flags>();
    }

    return CollectInternal<flags>();
}